

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute.cc
# Opt level: O0

void __thiscall
tchecker::system::attributes_t::add_attributes(attributes_t *this,attributes_t *attr)

{
  bool bVar1;
  const_iterator_t *pcVar2;
  string *key;
  string *value;
  attr_parsing_position_t *parsing_position;
  attr_parsing_position_t local_88;
  attr_t *local_48;
  attr_t *attr_1;
  const_iterator_t __end2;
  const_iterator_t __begin2;
  range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
  *__range2;
  attributes_t *attr_local;
  attributes_t *this_local;
  
  ___begin2 = range(attr);
  pcVar2 = range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
           ::begin((range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
                    *)&__begin2);
  __end2.super_const_iterator.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
  ._M_cur = (const_iterator)
            (pcVar2->super_const_iterator).
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
            ._M_cur;
  pcVar2 = range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
           ::end((range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
                  *)&__begin2);
  attr_1 = (attr_t *)
           (pcVar2->super_const_iterator).
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
           ._M_cur;
  while( true ) {
    bVar1 = std::__detail::operator!=
                      ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
                        *)&__end2,
                       (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
                        *)&attr_1);
    if (!bVar1) break;
    local_48 = &const_iterator_t::operator*(&__end2)->super_attr_t;
    key = parsing::attr_t::key_abi_cxx11_(local_48);
    value = parsing::attr_t::value_abi_cxx11_(local_48);
    parsing_position = parsing::attr_t::parsing_position(local_48);
    attr_parsing_position_t::attr_parsing_position_t(&local_88,parsing_position);
    add_attribute(this,key,value,&local_88);
    attr_parsing_position_t::~attr_parsing_position_t(&local_88);
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_false,_true>
    ::operator++(&__end2.super_const_iterator);
  }
  return;
}

Assistant:

void attributes_t::add_attributes(tchecker::system::attributes_t const & attr)
{
  for (auto && attr : attr.range())
    add_attribute(attr.key(), attr.value(), attr.parsing_position());
}